

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrueTypeEmbeddedFontWriter.cpp
# Opt level: O0

EStatusCode __thiscall TrueTypeEmbeddedFontWriter::WriteHead(TrueTypeEmbeddedFontWriter *this)

{
  TableEntry *pTVar1;
  IByteReaderWithPosition *pIVar2;
  IByteReader *inInputStream;
  LongFilePositionType inOffsetFromStart;
  LongFilePositionType endOfStream;
  OutputStreamTraits streamCopier;
  LongFilePositionType startTableOffset;
  TableEntry *tableEntry;
  TrueTypeEmbeddedFontWriter *this_local;
  
  pTVar1 = OpenTypeFileInput::GetTableEntry(&this->mTrueTypeInput,"head");
  if (pTVar1 == (TableEntry *)0x0) {
    this_local._4_4_ = eFailure;
  }
  else {
    OutputStreamTraits::OutputStreamTraits
              ((OutputStreamTraits *)&endOfStream,(IByteWriter *)&this->mFontFileStream);
    streamCopier.mOutputStream =
         (IByteWriter *)OutputStringBufferStream::GetCurrentPosition(&this->mFontFileStream);
    pIVar2 = InputFile::GetInputStream(&this->mTrueTypeFile);
    (*(pIVar2->super_IByteReader)._vptr_IByteReader[4])(pIVar2,pTVar1->Offset);
    inInputStream = &InputFile::GetInputStream(&this->mTrueTypeFile)->super_IByteReader;
    OutputStreamTraits::CopyToOutputStream
              ((OutputStreamTraits *)&endOfStream,inInputStream,pTVar1->Length);
    TrueTypePrimitiveWriter::PadTo4(&this->mPrimitivesWriter);
    inOffsetFromStart = OutputStringBufferStream::GetCurrentPosition(&this->mFontFileStream);
    this->mHeadCheckSumOffset = (LongFilePositionType)(streamCopier.mOutputStream + 1);
    OutputStringBufferStream::SetPosition(&this->mFontFileStream,this->mHeadCheckSumOffset);
    TrueTypePrimitiveWriter::WriteULONG(&this->mPrimitivesWriter,0);
    OutputStringBufferStream::SetPosition
              (&this->mFontFileStream,
               (LongFilePositionType)((long)&streamCopier.mOutputStream[6]._vptr_IByteWriter + 2));
    TrueTypePrimitiveWriter::WriteUSHORT(&this->mPrimitivesWriter,1);
    WriteTableEntryData(this,this->mHEADEntryWritingOffset,
                        (LongFilePositionType)streamCopier.mOutputStream,pTVar1->Length);
    OutputStringBufferStream::SetPosition(&this->mFontFileStream,inOffsetFromStart);
    this_local._4_4_ = TrueTypePrimitiveWriter::GetInternalState(&this->mPrimitivesWriter);
    OutputStreamTraits::~OutputStreamTraits((OutputStreamTraits *)&endOfStream);
  }
  return this_local._4_4_;
}

Assistant:

EStatusCode TrueTypeEmbeddedFontWriter::WriteHead()
{
	// copy as is, then adjust loca table format to long (that's what i'm always writing), 
	// set the checksum
	// and store the offset to the checksum

	TableEntry* tableEntry = mTrueTypeInput.GetTableEntry("head");
	if (!tableEntry) {
		return PDFHummus::eFailure;
	}
	LongFilePositionType startTableOffset;
	OutputStreamTraits streamCopier(&mFontFileStream);
	LongFilePositionType endOfStream;

	startTableOffset = mFontFileStream.GetCurrentPosition();

	// copy and save the current position
	mTrueTypeFile.GetInputStream()->SetPosition(tableEntry->Offset);
	streamCopier.CopyToOutputStream(mTrueTypeFile.GetInputStream(),tableEntry->Length);
	mPrimitivesWriter.PadTo4();
	endOfStream = mFontFileStream.GetCurrentPosition();

	// set the checksum to 0, and save its position for later update
	mHeadCheckSumOffset = startTableOffset + 8;
	mFontFileStream.SetPosition(mHeadCheckSumOffset);
	mPrimitivesWriter.WriteULONG(0);

	// set the loca format to longs
	mFontFileStream.SetPosition(startTableOffset + 50);
	mPrimitivesWriter.WriteUSHORT(1);

	// write table entry data, which includes movement
	WriteTableEntryData(mHEADEntryWritingOffset,startTableOffset,tableEntry->Length);

	// restore position to end of stream
	mFontFileStream.SetPosition(endOfStream); 

	return mPrimitivesWriter.GetInternalState();
}